

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

bool __thiscall rtosc::Port_Matcher::rtosc_match_args(Port_Matcher *this,char *pattern,char *msg)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = *pattern == ':';
  do {
    if (!bVar3) {
      return true;
    }
    pattern = pattern + 1;
    pcVar1 = rtosc_argument_string(msg);
    cVar2 = *pattern;
    bVar4 = true;
    if (cVar2 == '\0') {
      bVar4 = *pcVar1 == '\0';
    }
    while( true ) {
      if (cVar2 == '\0') {
        return bVar4;
      }
      if (cVar2 == ':') break;
      bVar4 = (bool)(bVar4 & cVar2 == *pcVar1);
      cVar2 = pattern[1];
      pattern = pattern + 1;
      pcVar1 = pcVar1 + 1;
    }
    bVar3 = true;
  } while ((bVar4 == false) || (*pcVar1 != '\0'));
  return true;
}

Assistant:

bool rtosc_match_args(const char *pattern, const char *msg)
        {
            //match anything if no arg restriction is present
            //(ie the ':')
            if(*pattern++ != ':')
                return true;

            const char *arg_str = rtosc_argument_string(msg);
            bool      arg_match = *pattern || *pattern == *arg_str;

            while(*pattern && *pattern != ':')
                arg_match &= (*pattern++==*arg_str++);

            if(*pattern==':') {
                if(arg_match && !*arg_str)
                    return true;
                else
                    return rtosc_match_args(pattern, msg); //retry
            }

            return arg_match;
        }